

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O2

int Sbd_ManCollectConstantsNew
              (sat_solver *pSat,Vec_Int_t *vDivVars,int nConsts,int PivotVar,word *pOnset,
              word *pOffset)

{
  word *pwVar1;
  int iVar2;
  uint i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iLit;
  int local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  word *pPats [2];
  
  local_64 = PivotVar;
  pPats[0] = pOnset;
  pPats[1] = pOffset;
  if (0x3f < vDivVars->nSize) {
    __assert_fail("Vec_IntSize(vDivVars) < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0x1b6,
                  "int Sbd_ManCollectConstantsNew(sat_solver *, Vec_Int_t *, int, int, word *, word *)"
                 );
  }
  local_50 = 0;
  uVar4 = (ulong)(uint)nConsts;
  local_60 = (ulong)(uint)nConsts;
  if (nConsts < 1) {
    uVar4 = local_50;
    local_60 = local_50;
  }
  do {
    if (local_50 == 2) {
      uVar3 = 0xffffffff;
LAB_00463a52:
      return (int)uVar3;
    }
    local_58 = local_50 & 0xffffffff ^ 1;
    for (uVar5 = 0; uVar3 = local_50, uVar5 != uVar4; uVar5 = uVar5 + 1) {
      sat_solver_random_polarity(pSat);
      iLit = Abc_Var2Lit(local_64,(int)uVar3);
      iVar2 = sat_solver_solve(pSat,&iLit,&local_64,0,0,0,0);
      if (iVar2 == -1) goto LAB_00463a52;
      if (iVar2 == 0) {
        uVar3 = 0xfffffffffffffffe;
        goto LAB_00463a52;
      }
      iVar2 = vDivVars->nSize;
      pwVar1 = pPats[uVar3] + uVar5;
      *pwVar1 = local_58 << ((byte)iVar2 & 0x3f);
      for (i = 0; (int)i < iVar2; i = i + 1) {
        iVar2 = Vec_IntEntry(vDivVars,i);
        iVar2 = sat_solver_var_value(pSat,iVar2);
        if (iVar2 != 0) {
          pwVar1[i >> 6] = pwVar1[i >> 6] ^ 1L << ((byte)i & 0x3f);
        }
        iVar2 = vDivVars->nSize;
      }
      uVar4 = local_60;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

int Sbd_ManCollectConstantsNew( sat_solver * pSat, Vec_Int_t * vDivVars, int nConsts, int PivotVar, word * pOnset, word * pOffset )
{
    int nBTLimit = 0;
    int n, i, k, status, iLit, iVar; 
    word * pPats[2] = {pOnset, pOffset};
    assert( Vec_IntSize(vDivVars) < 64 );
    for ( n = 0; n < 2; n++ )
    for ( i = 0; i < nConsts; i++ )
    {
        sat_solver_random_polarity( pSat );
        iLit = Abc_Var2Lit( PivotVar, n );
        status = sat_solver_solve( pSat, &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -2;
        if ( status == l_False )
            return n;
        pPats[n][i] = ((word)!n) << Vec_IntSize(vDivVars);
        Vec_IntForEachEntry( vDivVars, iVar, k )
            if ( sat_solver_var_value(pSat, iVar) )
                Abc_TtXorBit(&pPats[n][i], k);
    }
    return -1;
}